

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O3

void ugui_menu_widget_basic_cell_draw
               (ugui_graphics_t *graphics_ctx,ugui_rect_t *bounds,char *title,char *data)

{
  ushort uVar1;
  ushort uVar2;
  ugui_point_t a;
  char *text;
  int iVar3;
  uint uVar4;
  ugui_size_t local_4c;
  char *pcStack_48;
  ugui_size_t data_size;
  ugui_size_t local_38;
  uint local_34;
  ugui_size_t title_size;
  
  uVar1 = bounds->w;
  uVar2 = bounds->x;
  a.x = bounds->x;
  a.y = bounds->y;
  local_34 = (uint)bounds->y;
  uVar4 = local_34 << 0x10;
  pcStack_48 = data;
  ugui_graphics_draw_rect
            (graphics_ctx,a,(ugui_size_t)(uVar1 - 1 & 0xffff | (uint)bounds->h << 0x10));
  ugui_font_get_text_size(&font_robotomono_regular_18,title,&local_38);
  iVar3 = (uint)(uVar1 >> 1) + (uint)uVar2;
  ugui_graphics_draw_text
            (graphics_ctx,title,&font_robotomono_regular_18,
             (ugui_point_t)(iVar3 - (uint)(local_38.w >> 1) & 0xffff | uVar4));
  text = pcStack_48;
  ugui_font_get_text_size(&font_robotomono_regular_16,pcStack_48,&local_4c);
  ugui_graphics_draw_text
            (graphics_ctx,text,&font_robotomono_regular_16,
             (ugui_point_t)
             ((uint)(ushort)(local_38.h + (short)local_34) * 0x10000 +
              (iVar3 - (uint)(local_4c.w >> 1) & 0xffff) + 0x80000));
  return;
}

Assistant:

static void ugui_menu_widget_basic_cell_draw(ugui_graphics_t* graphics_ctx, ugui_rect_t* bounds, char* title , char* data)
{
	int w = bounds->w;
	int h = bounds->h;
	int x = bounds->x;
	int y = bounds->y;

	//Surround
	ugui_graphics_draw_rect(graphics_ctx,
	(ugui_point_t) {.x = x, .y = y},
	(ugui_size_t) {.w = w - 1, .h = h});
#if 1
	//Header
	ugui_size_t title_size;
	ugui_font_get_text_size(&font_robotomono_regular_18,
	                        title,
	                        &title_size);

	ugui_graphics_draw_text(graphics_ctx,
	                        title,
	                        &font_robotomono_regular_18,
	(ugui_point_t) {
		.x = x + w / 2 - title_size.w / 2, .y = y
	});

	//Data
	ugui_size_t data_size;
	ugui_font_get_text_size(&font_robotomono_regular_16,
	                        data,
	                        &data_size);

	ugui_graphics_draw_text(graphics_ctx,
	                        data,
	                        &font_robotomono_regular_16,
	(ugui_point_t) {
		.x = x + w / 2 - data_size.w / 2, .y = y + title_size.h + 8
	});
#endif
}